

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCacheStore(Parse *pParse,int iTab,int iCol,int iReg)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if ((pParse->db->dbOptFlags & 2) == 0) {
    uVar2 = (ulong)pParse->nColCache;
    if (uVar2 < 10) {
      pParse->nColCache = pParse->nColCache + 1;
    }
    else {
      piVar1 = &pParse->aColCache[0].lru;
      iVar3 = 0;
      iVar5 = 0x7fffffff;
      iVar4 = -1;
      do {
        if (*piVar1 < iVar5) {
          iVar5 = *piVar1;
          iVar4 = iVar3;
        }
        iVar3 = iVar3 + 1;
        piVar1 = piVar1 + 5;
      } while (iVar3 != 10);
      uVar2 = (ulong)iVar4;
    }
    pParse->aColCache[uVar2].iLevel = pParse->iCacheLevel;
    pParse->aColCache[uVar2].iTable = iTab;
    pParse->aColCache[uVar2].iColumn = (i16)iCol;
    pParse->aColCache[uVar2].iReg = iReg;
    pParse->aColCache[uVar2].tempReg = '\0';
    iVar5 = pParse->iCacheCnt;
    pParse->iCacheCnt = iVar5 + 1;
    pParse->aColCache[uVar2].lru = iVar5;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheStore(Parse *pParse, int iTab, int iCol, int iReg){
  int i;
  int minLru;
  int idxLru;
  struct yColCache *p;

  /* Unless an error has occurred, register numbers are always positive. */
  assert( iReg>0 || pParse->nErr || pParse->db->mallocFailed );
  assert( iCol>=-1 && iCol<32768 );  /* Finite column numbers */

  /* The SQLITE_ColumnCache flag disables the column cache.  This is used
  ** for testing only - to verify that SQLite always gets the same answer
  ** with and without the column cache.
  */
  if( OptimizationDisabled(pParse->db, SQLITE_ColumnCache) ) return;

  /* First replace any existing entry.
  **
  ** Actually, the way the column cache is currently used, we are guaranteed
  ** that the object will never already be in cache.  Verify this guarantee.
  */
#ifndef NDEBUG
  for(i=0, p=pParse->aColCache; i<pParse->nColCache; i++, p++){
    assert( p->iTable!=iTab || p->iColumn!=iCol );
  }
#endif

  /* If the cache is already full, delete the least recently used entry */
  if( pParse->nColCache>=SQLITE_N_COLCACHE ){
    minLru = 0x7fffffff;
    idxLru = -1;
    for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
      if( p->lru<minLru ){
        idxLru = i;
        minLru = p->lru;
      }
    }
    p = &pParse->aColCache[idxLru];
  }else{
    p = &pParse->aColCache[pParse->nColCache++];
  }

  /* Add the new entry to the end of the cache */
  p->iLevel = pParse->iCacheLevel;
  p->iTable = iTab;
  p->iColumn = iCol;
  p->iReg = iReg;
  p->tempReg = 0;
  p->lru = pParse->iCacheCnt++;
}